

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_gcd.c
# Opt level: O2

void zzGCD(word *d,word *a,size_t n,word *b,size_t m,void *stack)

{
  word *b_00;
  int iVar1;
  bool_t bVar2;
  size_t sVar3;
  size_t sVar4;
  size_t n_00;
  size_t sVar5;
  word w;
  word *a_00;
  word *a_01;
  word *b_01;
  size_t n_01;
  
  b_00 = (word *)((long)stack + n * 8);
  sVar3 = m;
  if (n < m) {
    sVar3 = n;
  }
  wwSetZero(d,sVar3);
  wwCopy((word *)stack,a,n);
  wwCopy(b_00,b,m);
  sVar3 = wwLoZeroBits((word *)stack,n);
  sVar4 = wwLoZeroBits(b_00,m);
  sVar3 = utilMin(2,sVar3,sVar4);
  wwShLo((word *)stack,n,sVar3);
  sVar4 = wwWordSize((word *)stack,n);
  wwShLo(b_00,m,sVar3);
  n_00 = wwWordSize(b_00,m);
  do {
    sVar5 = wwLoZeroBits((word *)stack,sVar4);
    wwShLo((word *)stack,sVar4,sVar5);
    sVar4 = wwWordSize((word *)stack,sVar4);
    sVar5 = wwLoZeroBits(b_00,n_00);
    wwShLo(b_00,n_00,sVar5);
    n_00 = wwWordSize(b_00,n_00);
    iVar1 = wwCmp2((word *)stack,sVar4,b_00,n_00);
    if (iVar1 < 1) {
      a_00 = b_00 + sVar4;
      n_01 = n_00 - sVar4;
      sVar5 = sVar4;
      a_01 = (word *)stack;
      b_01 = b_00;
    }
    else {
      a_00 = (word *)((long)stack + n_00 * 8);
      n_01 = sVar4 - n_00;
      sVar5 = n_00;
      a_01 = b_00;
      b_01 = (word *)stack;
    }
    w = zzSub2(b_01,a_01,sVar5);
    zzSubW2(a_00,n_01,w);
    bVar2 = wwIsZero(b_00,n_00);
  } while (bVar2 == 0);
  wwCopy(d,(word *)stack,sVar4);
  sVar4 = wwBitSize(d,n_00);
  wwShHi(d,sVar3 + sVar4 + 0x3f >> 6,sVar3);
  return;
}

Assistant:

void zzGCD(word d[], const word a[], size_t n, const word b[], size_t m,
	void* stack)
{
	register size_t s;
	// переменные в stack
	word* u = (word*)stack;
	word* v = u + n;
	stack = v + m;
	// pre
	ASSERT(wwIsDisjoint2(a, n, d, MIN2(n, m)));
	ASSERT(wwIsDisjoint2(b, m, d, MIN2(n, m)));
	ASSERT(!wwIsZero(a, n) && !wwIsZero(b, m));
	// d <- 0
	wwSetZero(d, MIN2(n, m));
	// u <- a, v <- b
	wwCopy(u, a, n);
	wwCopy(v, b, m);
	// найти максимальное s т.ч. 2^s | u и 2^s | v
	s = utilMin(2, wwLoZeroBits(u, n), wwLoZeroBits(v, m));
	// u <- u / 2^s, v <- v / 2^s
	wwShLo(u, n, s);
	n = wwWordSize(u, n);
	wwShLo(v, m, s);
	m = wwWordSize(v, m);
	// итерации
	do
	{
		wwShLo(u, n, wwLoZeroBits(u, n));
		n = wwWordSize(u, n);
		wwShLo(v, m, wwLoZeroBits(v, m));
		m = wwWordSize(v, m);
		// u > v?
		if (wwCmp2(u, n, v, m) > 0)
			// u <- u - v
			zzSubW2(u + m, n - m, zzSub2(u, v, m));
		else
			// v <- v - u
			zzSubW2(v + n, m - n, zzSub2(v, u, n));
	} while (!wwIsZero(v, m));
	// d <- v
	wwCopy(d, u, n);
	// d <- d * 2^s
	wwShHi(d, W_OF_B(wwBitSize(d, m) + s), s);
	// очистка
	s = 0;
}